

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *pEVar1;
  ENetList *pEVar2;
  ushort uVar3;
  enet_uint16 eVar4;
  ushort uVar5;
  int iVar6;
  _ENetListNode *p_Var7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  _ENetHost *p_Var10;
  ENetListIterator first;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var11;
  ENetIncomingCommand *startCommand;
  ENetIncomingCommand *excludeCommand;
  ENetIncomingCommand *pEVar12;
  ushort uVar13;
  
  p_Var7 = (channel->incomingReliableCommands).sentinel.next;
  p_Var11 = p_Var7;
  if (p_Var7 != &(channel->incomingReliableCommands).sentinel) {
    do {
      if ((*(int *)&p_Var11[4].previous != 0) ||
         (eVar4 = *(enet_uint16 *)&p_Var11[1].next,
         eVar4 != (enet_uint16)(channel->incomingReliableSequenceNumber + 1))) break;
      channel->incomingReliableSequenceNumber = eVar4;
      iVar6 = *(int *)((long)&p_Var11[4].next + 4);
      if (iVar6 != 0) {
        channel->incomingReliableSequenceNumber = (eVar4 + (short)iVar6) - 1;
      }
      p_Var11 = p_Var11->next;
    } while (p_Var11 != &(channel->incomingReliableCommands).sentinel);
    if (p_Var11 != p_Var7) {
      channel->incomingUnreliableSequenceNumber = 0;
      excludeCommand = (ENetIncomingCommand *)&peer->dispatchedCommands;
      p_Var11 = p_Var11->previous;
      p_Var8 = p_Var11->next;
      p_Var9 = p_Var7->previous;
      p_Var9->next = p_Var8;
      p_Var8->previous = p_Var9;
      p_Var8 = (peer->dispatchedCommands).sentinel.previous;
      p_Var7->previous = p_Var8;
      p_Var11->next = (_ENetListNode *)excludeCommand;
      p_Var8->next = p_Var7;
      (peer->dispatchedCommands).sentinel.previous = p_Var11;
      uVar5 = peer->flags;
      if ((uVar5 & 1) == 0) {
        p_Var10 = peer->host;
        excludeCommand = (ENetIncomingCommand *)&p_Var10->dispatchQueue;
        p_Var7 = (p_Var10->dispatchQueue).sentinel.previous;
        (peer->dispatchList).previous = p_Var7;
        (peer->dispatchList).next = (_ENetListNode *)excludeCommand;
        p_Var7->next = &peer->dispatchList;
        (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
        peer->flags = uVar5 | 1;
      }
      if ((channel->incomingUnreliableCommands).sentinel.next !=
          &(channel->incomingUnreliableCommands).sentinel) {
        pEVar1 = &channel->incomingUnreliableCommands;
        startCommand = (ENetIncomingCommand *)(channel->incomingUnreliableCommands).sentinel.next;
        if (startCommand != (ENetIncomingCommand *)pEVar1) {
          pEVar2 = &peer->dispatchedCommands;
          excludeCommand = startCommand;
          pEVar12 = startCommand;
          do {
            if (((excludeCommand->command).header.command & 0xf) != 9) {
              uVar5 = excludeCommand->reliableSequenceNumber;
              uVar3 = channel->incomingReliableSequenceNumber;
              if (uVar5 == uVar3) {
                if (excludeCommand->fragmentsRemaining == 0) {
                  channel->incomingUnreliableSequenceNumber =
                       excludeCommand->unreliableSequenceNumber;
                  goto LAB_00105ca9;
                }
                if (pEVar12 == excludeCommand) {
                  if (startCommand != pEVar12) {
                    startCommand = (ENetIncomingCommand *)
                                   (excludeCommand->incomingCommandList).previous;
                  }
                }
                else {
                  p_Var7 = (excludeCommand->incomingCommandList).previous;
                  p_Var11 = p_Var7->next;
                  p_Var8 = (pEVar12->incomingCommandList).previous;
                  p_Var8->next = p_Var11;
                  p_Var11->previous = p_Var8;
                  p_Var11 = (peer->dispatchedCommands).sentinel.previous;
                  (pEVar12->incomingCommandList).previous = p_Var11;
                  p_Var7->next = &pEVar2->sentinel;
                  p_Var11->next = &pEVar12->incomingCommandList;
                  (peer->dispatchedCommands).sentinel.previous = p_Var7;
                  uVar5 = peer->flags;
                  startCommand = excludeCommand;
                  if ((uVar5 & 1) == 0) {
                    p_Var10 = peer->host;
                    p_Var7 = (p_Var10->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var7;
                    (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
                    p_Var7->next = &peer->dispatchList;
                    (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->flags = uVar5 | 1;
                  }
                }
              }
              else {
                uVar13 = (uVar5 >> 0xc) + 0x10;
                if (uVar3 <= uVar5) {
                  uVar13 = uVar5 >> 0xc;
                }
                if (uVar3 >> 0xc <= uVar13 && uVar13 < (ushort)((uVar3 >> 0xc) + 7)) break;
                startCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
                if (pEVar12 != excludeCommand) {
                  p_Var7 = (excludeCommand->incomingCommandList).previous;
                  p_Var11 = p_Var7->next;
                  p_Var8 = (pEVar12->incomingCommandList).previous;
                  p_Var8->next = p_Var11;
                  p_Var11->previous = p_Var8;
                  p_Var11 = (peer->dispatchedCommands).sentinel.previous;
                  (pEVar12->incomingCommandList).previous = p_Var11;
                  p_Var7->next = &pEVar2->sentinel;
                  p_Var11->next = &pEVar12->incomingCommandList;
                  (peer->dispatchedCommands).sentinel.previous = p_Var7;
                  uVar5 = peer->flags;
                  if ((uVar5 & 1) == 0) {
                    p_Var10 = peer->host;
                    p_Var7 = (p_Var10->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var7;
                    (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
                    p_Var7->next = &peer->dispatchList;
                    (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->flags = uVar5 | 1;
                  }
                }
              }
              pEVar12 = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
            }
LAB_00105ca9:
            excludeCommand = (ENetIncomingCommand *)(excludeCommand->incomingCommandList).next;
          } while (excludeCommand != (ENetIncomingCommand *)pEVar1);
          if (pEVar12 != excludeCommand) {
            p_Var7 = (excludeCommand->incomingCommandList).previous;
            p_Var11 = p_Var7->next;
            p_Var8 = (pEVar12->incomingCommandList).previous;
            p_Var8->next = p_Var11;
            p_Var11->previous = p_Var8;
            p_Var11 = (peer->dispatchedCommands).sentinel.previous;
            (pEVar12->incomingCommandList).previous = p_Var11;
            p_Var7->next = &pEVar2->sentinel;
            p_Var11->next = &pEVar12->incomingCommandList;
            (peer->dispatchedCommands).sentinel.previous = p_Var7;
            uVar5 = peer->flags;
            startCommand = excludeCommand;
            if ((uVar5 & 1) == 0) {
              p_Var10 = peer->host;
              p_Var7 = (p_Var10->dispatchQueue).sentinel.previous;
              (peer->dispatchList).previous = p_Var7;
              (peer->dispatchList).next = &(p_Var10->dispatchQueue).sentinel;
              p_Var7->next = &peer->dispatchList;
              (p_Var10->dispatchQueue).sentinel.previous = &peer->dispatchList;
              peer->flags = uVar5 | 1;
            }
          }
        }
        enet_peer_remove_incoming_commands
                  (peer,(ENetList *)(pEVar1->sentinel).next,&startCommand->incomingCommandList,
                   &queuedCommand->incomingCommandList,excludeCommand);
        return;
      }
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer *peer, ENetChannel *channel, ENetIncomingCommand *queuedCommand) {
        ENetListIterator currentCommand;

        for (currentCommand = enet_list_begin(&channel->incomingReliableCommands);
            currentCommand != enet_list_end(&channel->incomingReliableCommands);
            currentCommand = enet_list_next(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (enet_uint16) (channel->incomingReliableSequenceNumber + 1)) {
                break;
            }

            channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

            if (incomingCommand->fragmentCount > 0) {
                channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
            }
        }

        if (currentCommand == enet_list_begin(&channel->incomingReliableCommands)) {
            return;
        }

        channel->incomingUnreliableSequenceNumber = 0;
        enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

        if (!(peer->flags & ENET_PEER_FLAG_NEEDS_DISPATCH)) {
            enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);
            peer->flags |= ENET_PEER_FLAG_NEEDS_DISPATCH;
        }

        if (!enet_list_empty(&channel->incomingUnreliableCommands)) {
            enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
        }
    }